

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::phase1ComputeDual(HEkkPrimal *this)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  size_type __n;
  long *in_RDI;
  double dVar6;
  HighsInt iCol_1;
  HighsInt iRow_2;
  HighsInt iCol;
  HVector bufferLong;
  HighsInt iRow_1;
  double cost;
  HighsInt bound_violated;
  double upper;
  double lower;
  double value;
  HighsInt iRow;
  double base;
  HVector buffer;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicFlag;
  HighsSimplexInfo *info;
  size_type in_stack_fffffffffffffdb8;
  HVectorBase<double> *in_stack_fffffffffffffdc0;
  HVector *in_stack_fffffffffffffdc8;
  HighsInt size_;
  HEkk *in_stack_fffffffffffffdd0;
  HVector *full_col;
  HEkk *in_stack_fffffffffffffde0;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  HVector local_1d8;
  int local_128;
  undefined4 local_124;
  double local_120;
  uint local_114;
  double local_110;
  double local_108;
  value_type local_100;
  int local_f4;
  double local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_c4;
  vector<int,_std::allocator<int>_> vStack_c0;
  vector<double,_std::allocator<double>_> avStack_a8 [6];
  vector<signed_char,_std::allocator<signed_char>_> *local_18;
  HEkk *local_10;
  
  local_10 = (HEkk *)(*in_RDI + 0x2560);
  local_18 = (vector<signed_char,_std::allocator<signed_char>_> *)(*in_RDI + 0x2990);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdc0);
  HVectorBase<double>::setup
            ((HVectorBase<double> *)in_stack_fffffffffffffdd0,
             (HighsInt)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  HVectorBase<double>::clear((HVectorBase<double> *)in_stack_fffffffffffffde0);
  local_c4 = 0;
  local_e0 = 0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,(value_type_conflict1 *)0x7a9519);
  local_e8 = 0;
  std::vector<double,_std::allocator<double>_>::assign
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,(value_type_conflict1 *)0x7a9549);
  local_f0 = *(double *)&(local_10->analysis_).before_ftran_upper_sparse_density.num_one_ * 5e-07;
  for (local_f4 = 0; local_f4 < *(int *)((long)in_RDI + 0x14); local_f4 = local_f4 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(local_10->analysis_).analyse_lp_data,(long)local_f4);
    local_100 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(local_10->analysis_).log_options.user_callback,(long)local_f4);
    local_108 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(local_10->analysis_).log_options.user_callback._M_invoker,(long)local_f4);
    dVar6 = local_f0;
    local_110 = *pvVar3;
    if (local_108 - (double)in_RDI[5] <= local_100) {
      local_114 = (uint)(local_110 + (double)in_RDI[5] < local_100);
    }
    else {
      local_114 = 0xffffffff;
    }
    if (local_114 != 0) {
      local_120 = (double)(int)local_114;
      if ((local_f0 != 0.0) || (NAN(local_f0))) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &(local_10->analysis_).devex_iteration_count,(long)local_f4);
        local_120 = (dVar6 * *pvVar3 + 1.0) * local_120;
      }
      dVar6 = local_120;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_a8,(long)local_f4);
      iVar2 = local_f4;
      *pvVar3 = dVar6;
      __n = (size_type)local_c4;
      local_c4 = local_c4 + 1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_c0,__n);
      *pvVar4 = iVar2;
    }
  }
  if (local_c4 < 1) {
    local_124 = 1;
  }
  else {
    for (local_128 = 0; local_128 < *(int *)((long)in_RDI + 0x14); local_128 = local_128 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_a8,(long)local_128);
      vVar1 = *pvVar3;
      in_stack_fffffffffffffde0 = local_10;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(*in_RDI + 0x2978),(long)local_128);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                          (long)*pvVar4);
      *pvVar3 = vVar1;
    }
    HEkk::fullBtran(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    size_ = (HighsInt)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    full_col = &local_1d8;
    HVectorBase<double>::HVectorBase(in_stack_fffffffffffffdc0);
    HVectorBase<double>::setup((HVectorBase<double> *)in_stack_fffffffffffffdd0,size_);
    HEkk::fullPrice(in_stack_fffffffffffffde0,full_col,(HVector *)in_stack_fffffffffffffdd0);
    for (local_1dc = 0; local_1dc < (int)in_RDI[2]; local_1dc = local_1dc + 1) {
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (local_18,(long)local_1dc);
      dVar6 = (double)-(int)*pvVar5;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_1d8.array,(long)local_1dc);
      dVar6 = dVar6 * *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_10->analysis_,
                          (long)local_1dc);
      *pvVar3 = dVar6;
    }
    local_1e0 = 0;
    local_1e4 = (int)in_RDI[2];
    for (; local_1e0 < *(int *)((long)in_RDI + 0x14); local_1e0 = local_1e0 + 1) {
      pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (local_18,(long)local_1e4);
      dVar6 = (double)-(int)*pvVar5;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](avStack_a8,(long)local_1e0);
      in_stack_fffffffffffffdc0 = (HVectorBase<double> *)(dVar6 * *pvVar3);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_10->analysis_,
                          (long)local_1e4);
      *pvVar3 = (value_type)in_stack_fffffffffffffdc0;
      local_1e4 = local_1e4 + 1;
    }
    HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffdc0);
    local_124 = 0;
  }
  HVectorBase<double>::~HVectorBase(in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void HEkkPrimal::phase1ComputeDual() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<int8_t>& nonbasicFlag = ekk_instance_.basis_.nonbasicFlag_;

  HVector buffer;
  buffer.setup(num_row);
  buffer.clear();
  buffer.count = 0;
  // Accumulate costs for checking
  info.workCost_.assign(num_tot, 0);
  // Zero the dual values
  info.workDual_.assign(num_tot, 0);
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    const double value = info.baseValue_[iRow];
    const double lower = info.baseLower_[iRow];
    const double upper = info.baseUpper_[iRow];
    HighsInt bound_violated = 0;
    if (value < lower - primal_feasibility_tolerance) {
      bound_violated = -1;
    } else if (value > upper + primal_feasibility_tolerance) {
      bound_violated = 1;
    }
    if (!bound_violated) continue;
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[iRow];
    buffer.array[iRow] = cost;
    buffer.index[buffer.count++] = iRow;
  }
  if (buffer.count <= 0) {
    // Strange, should be a non-trivial RHS
    assert(buffer.count > 0);
    return;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++)
    info.workCost_[ekk_instance_.basis_.basicIndex_[iRow]] = buffer.array[iRow];
  //
  // Full BTRAN
  //
  ekk_instance_.fullBtran(buffer);
  //
  // Full PRICE
  //
  HVector bufferLong;
  bufferLong.setup(num_col);
  ekk_instance_.fullPrice(buffer, bufferLong);

  for (HighsInt iCol = 0; iCol < num_col; iCol++)
    info.workDual_[iCol] = -nonbasicFlag[iCol] * bufferLong.array[iCol];
  for (HighsInt iRow = 0, iCol = num_col; iRow < num_row; iRow++, iCol++)
    info.workDual_[iCol] = -nonbasicFlag[iCol] * buffer.array[iRow];
}